

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::getNeededPoints
          (TasmanianSparseGrid *this,vector<double,_std::allocator<double>_> *x)

{
  int a;
  int b;
  size_t __new_size;
  vector<double,_std::allocator<double>_> *x_local;
  TasmanianSparseGrid *this_local;
  
  a = getNumDimensions(this);
  b = getNumNeeded(this);
  __new_size = Utils::size_mult<int,int>(a,b);
  std::vector<double,_std::allocator<double>_>::resize(x,__new_size);
  std::vector<double,_std::allocator<double>_>::data(x);
  TasGrid::TasmanianSparseGrid::getNeededPoints((double *)this);
  return;
}

Assistant:

void getNeededPoints(std::vector<double> &x) const{ x.resize(Utils::size_mult(getNumDimensions(), getNumNeeded())); getNeededPoints(x.data()); }